

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmap.c
# Opt level: O3

void * coll_tmap_insert(coll_tmap_t *map,void *key,void *value)

{
  coll_entry_color_t cVar1;
  void *pvVar2;
  uint uVar3;
  long lVar4;
  coll_tmap_entry_t *pcVar5;
  coll_tmap_t *pcVar6;
  coll_tmap_entry_t *pcVar7;
  coll_tmap_entry_t *pcVar8;
  entry_t_conflict *l;
  coll_tmap_entry_t *pcVar9;
  entry_t_conflict *entry;
  coll_tmap_entry_t *pcVar10;
  
  pcVar8 = map->root;
  if (map->root == (coll_tmap_entry_t *)0x0) {
    pcVar8 = (coll_tmap_entry_t *)malloc(0x30);
    pcVar8->key = key;
    pcVar8->val = value;
    pcVar8->left = (coll_tmap_entry_t *)0x0;
    pcVar8->right = (coll_tmap_entry_t *)0x0;
    *(undefined8 *)((long)&pcVar8->right + 1) = 0;
    *(undefined8 *)((long)&pcVar8->parent + 1) = 0;
    map->root = pcVar8;
  }
  else {
    do {
      pcVar10 = pcVar8;
      uVar3 = (*map->cmp)(key,pcVar10->key);
      if ((int)uVar3 < 0) {
        lVar4 = 0x10;
      }
      else {
        lVar4 = 0x18;
        if (uVar3 == 0) {
          pvVar2 = pcVar10->val;
          pcVar10->val = value;
          return pvVar2;
        }
      }
      pcVar8 = *(coll_tmap_entry_t **)((long)&pcVar10->key + lVar4);
    } while (pcVar8 != (coll_tmap_entry_t *)0x0);
    pcVar5 = (coll_tmap_entry_t *)malloc(0x30);
    pcVar5->key = key;
    pcVar5->val = value;
    pcVar5->parent = pcVar10;
    pcVar5->left = (coll_tmap_entry_t *)0x0;
    pcVar5->right = (coll_tmap_entry_t *)0x0;
    (&pcVar10->left)[~uVar3 >> 0x1f] = pcVar5;
    pcVar5->color = '\x01';
    pcVar8 = map->root;
    if (pcVar5 != pcVar8) {
      pcVar10 = pcVar5->parent;
      cVar1 = pcVar10->color;
      while (cVar1 == '\x01') {
        pcVar7 = pcVar10->parent;
        if (pcVar7 == (entry_t_conflict *)0x0) {
LAB_00105a11:
          pcVar8 = pcVar10->left;
          pcVar9 = pcVar10;
          entry = pcVar7;
          if (pcVar5 == pcVar8) {
            pcVar5 = pcVar8->right;
            pcVar10->left = pcVar5;
            if (pcVar5 != (coll_tmap_entry_t *)0x0) {
              pcVar5->parent = pcVar10;
              pcVar7 = pcVar10->parent;
            }
            pcVar8->parent = pcVar7;
            pcVar6 = map;
            if (pcVar7 != (entry_t_conflict *)0x0) {
              pcVar6 = (coll_tmap_t *)&pcVar7->left;
              if (pcVar7->right == pcVar10) {
                pcVar6 = (coll_tmap_t *)&pcVar7->right;
              }
            }
            pcVar6->root = pcVar8;
            pcVar8->right = pcVar10;
            pcVar10->parent = pcVar8;
            pcVar9 = pcVar8;
            entry = pcVar8->parent;
            pcVar5 = pcVar10;
          }
          pcVar7 = pcVar5;
          pcVar9->color = '\0';
          if (entry != (entry_t_conflict *)0x0) {
            entry->color = '\x01';
          }
          entry_rotate_left(map,entry);
        }
        else {
          pcVar8 = pcVar7->left;
          if (pcVar10 == pcVar8) {
            pcVar8 = pcVar7->right;
            if ((pcVar8 == (coll_tmap_entry_t *)0x0) || (pcVar8->color != '\x01')) {
              pcVar8 = pcVar10->right;
              if (pcVar5 == pcVar8) {
                pcVar5 = pcVar8->left;
                pcVar10->right = pcVar5;
                if (pcVar5 == (coll_tmap_entry_t *)0x0) {
                  pcVar8->parent = pcVar7;
LAB_00105ad5:
                  pcVar6 = (coll_tmap_t *)&pcVar7->right;
                  if (pcVar7->left == pcVar10) {
                    pcVar6 = (coll_tmap_t *)&pcVar7->left;
                  }
                }
                else {
                  pcVar5->parent = pcVar10;
                  pcVar7 = pcVar10->parent;
                  pcVar8->parent = pcVar7;
                  pcVar6 = map;
                  if (pcVar7 != (coll_tmap_entry_t *)0x0) goto LAB_00105ad5;
                }
                pcVar6->root = pcVar8;
                pcVar8->left = pcVar10;
                pcVar10->parent = pcVar8;
                pcVar9 = pcVar8->parent;
                pcVar8->color = '\0';
                if (pcVar9 != (coll_tmap_entry_t *)0x0) goto LAB_00105afd;
                pcVar9 = (entry_t_conflict *)0x0;
                pcVar7 = pcVar10;
              }
              else {
                pcVar10->color = '\0';
                pcVar9 = pcVar7;
                pcVar10 = pcVar5;
LAB_00105afd:
                pcVar9->color = '\x01';
                pcVar7 = pcVar10;
              }
              entry_rotate_right(map,pcVar9);
              goto LAB_00105b0c;
            }
          }
          else if ((pcVar8 == (coll_tmap_entry_t *)0x0) || (pcVar8->color != '\x01'))
          goto LAB_00105a11;
          pcVar10->color = '\0';
          pcVar8->color = '\0';
          pcVar7->color = '\x01';
        }
LAB_00105b0c:
        pcVar8 = map->root;
        if (pcVar7 == pcVar8) break;
        pcVar10 = pcVar7->parent;
        pcVar5 = pcVar7;
        cVar1 = pcVar10->color;
      }
    }
    if (pcVar8 != (coll_tmap_entry_t *)0x0) {
      pcVar8->color = '\0';
    }
  }
  map->size = map->size + 1;
  return (void *)0x0;
}

Assistant:

void *coll_tmap_insert(coll_tmap_t *map, void *key, void *value) {
    entry_t *cur = map->root;
    if (!cur) {
        map->root = entry_new(key, value, NULL);
        ++(map->size);
        return NULL;
    }
    entry_t *parent = NULL;
    int result = 0;
    while (cur) {
        parent = cur;
        result = map->cmp(key, cur->key);
        if (result < 0) {
            cur = cur->left;
        } else if (result > 0) {
            cur = cur->right;
        } else {
            void *old = cur->val;
            cur->val = value;
            return old;
        }
    }
    entry_t *entry = entry_new(key, value, parent);
    if (result < 0) {
        parent->left = entry;
    } else {
        parent->right = entry;
    }
    coll_tmap_balance_insert(map, entry);
    ++(map->size);
    return NULL;
}